

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

ProducerBase * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
recycle_or_create_producer
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          bool isExplicit,bool *recycled)

{
  ProducerBase *pPVar1;
  ProducerBase *pPVar2;
  _func_int ***ppp_Var3;
  ExplicitProducer *this_00;
  __pointer_type pPVar4;
  __pointer_type pPVar5;
  ConcurrentQueueProducerTypelessBase *pCVar6;
  bool bVar7;
  
  pPVar1 = (this->producerListTail)._M_b._M_p;
  pPVar2 = pPVar1;
  do {
    if (pPVar2 == (ProducerBase *)0x0) {
      *recycled = false;
      if (isExplicit) {
        this_00 = (ExplicitProducer *)malloc(0x88);
        if (this_00 == (ExplicitProducer *)0x0) {
          return (ProducerBase *)0x0;
        }
        ExplicitProducer::ExplicitProducer(this_00,this);
      }
      else {
        this_00 = (ExplicitProducer *)malloc(0x68);
        if (this_00 == (ExplicitProducer *)0x0) {
          return (ProducerBase *)0x0;
        }
        (this_00->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next =
             (ConcurrentQueueProducerTypelessBase *)0x0;
        (this_00->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.inactive._M_base.
        _M_i = false;
        (this_00->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.token =
             (ProducerToken *)0x0;
        (this_00->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = 0;
        (this_00->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i = 0;
        (this_00->super_ProducerBase).dequeueOptimisticCount.super___atomic_base<unsigned_long>._M_i
             = 0;
        (this_00->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i = 0;
        (this_00->super_ProducerBase).tailBlock = (Block *)0x0;
        (this_00->super_ProducerBase).isExplicit = false;
        (this_00->super_ProducerBase).parent = this;
        (this_00->super_ProducerBase)._vptr_ProducerBase =
             (_func_int **)&PTR__ImplicitProducer_001668c0;
        (this_00->blockIndex)._M_b._M_p = (__pointer_type)0x20;
        this_00->pr_blockIndexSlotsUsed = 0;
        ImplicitProducer::new_block_index((ImplicitProducer *)this_00);
      }
      LOCK();
      (this->producerCount).super___atomic_base<unsigned_int>._M_i =
           (this->producerCount).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      pPVar4 = (this->producerListTail)._M_b._M_p;
      do {
        pCVar6 = &pPVar4->super_ConcurrentQueueProducerTypelessBase;
        if (pPVar4 == (__pointer_type)0x0) {
          pCVar6 = (ConcurrentQueueProducerTypelessBase *)0x0;
        }
        (this_00->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next = pCVar6;
        LOCK();
        pPVar5 = (this->producerListTail)._M_b._M_p;
        bVar7 = pPVar4 == pPVar5;
        if (bVar7) {
          (this->producerListTail)._M_b._M_p = &this_00->super_ProducerBase;
          pPVar5 = pPVar4;
        }
        UNLOCK();
        pPVar4 = pPVar5;
      } while (!bVar7);
      return &this_00->super_ProducerBase;
    }
    if (((*(__int_type_conflict1 *)((long)&pPVar1->super_ConcurrentQueueProducerTypelessBase + 8) &
         1U) != 0) && (pPVar1->isExplicit == isExplicit)) {
      ppp_Var3 = (_func_int ***)((long)&pPVar1->super_ConcurrentQueueProducerTypelessBase + 8);
      LOCK();
      bVar7 = *(__int_type_conflict1 *)ppp_Var3 == true;
      if (bVar7) {
        *(__int_type_conflict1 *)ppp_Var3 = false;
      }
      UNLOCK();
      if (bVar7) {
        *recycled = true;
        return pPVar1;
      }
    }
    pPVar2 = *(ProducerBase **)&pPVar1->super_ConcurrentQueueProducerTypelessBase;
    pPVar1 = (ProducerBase *)((long)(pPVar2 + 0xffffffffffffffff) + 0x50);
  } while( true );
}

Assistant:

ProducerBase* recycle_or_create_producer(bool isExplicit, bool& recycled)
	{
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		// Try to re-use one first
		for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
			if (ptr->inactive.load(std::memory_order_relaxed) && ptr->isExplicit == isExplicit) {
				bool expected = true;
				if (ptr->inactive.compare_exchange_strong(expected, /* desired */ false, std::memory_order_acquire, std::memory_order_relaxed)) {
					// We caught one! It's been marked as activated, the caller can have it
					recycled = true;
					return ptr;
				}
			}
		}
		
		recycled = false;
		return add_producer(isExplicit ? static_cast<ProducerBase*>(create<ExplicitProducer>(this)) : create<ImplicitProducer>(this));
	}